

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall NumberTemp::ProcessInstr(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  SymID stackSymID;
  SymTable *this_00;
  code *pcVar1;
  bool bVar2;
  int propertyId;
  undefined4 *puVar3;
  Opnd *pOVar4;
  RegOpnd *pRVar5;
  BVSparse<Memory::JitArenaAllocator> *bv;
  StackSym *pSVar6;
  PropertySym *pPVar7;
  BVSparse<Memory::JitArenaAllocator> **ppBVar8;
  JitArenaAllocator *pJVar9;
  BVSparse<Memory::JitArenaAllocator> **srcBv;
  PropertySym *propertySym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex index;
  SymTable *symTable;
  SymID srcStackSymId;
  BVSparse<Memory::JitArenaAllocator> *dstBv;
  StackSym *pSStack_30;
  SymID dstSymId;
  StackSym *dstSym;
  Opnd *dst;
  BackwardPass *backwardPass_local;
  Instr *instr_local;
  NumberTemp *this_local;
  
  if (instr->m_opcode == BailOnNoProfile) {
    if ((this->nonTempElemLoad & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,600,"(!this->nonTempElemLoad)","!this->nonTempElemLoad");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((BVSparse<Memory::JitArenaAllocator> *)this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x259,"(this->nonTempSyms.IsEmpty())","this->nonTempSyms.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (&(this->super_TempTrackerBase).tempTransferredSyms);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25a,"(this->tempTransferredSyms.IsEmpty())",
                         "this->tempTransferredSyms.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(&this->elemLoadDependencies);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25b,"(this->elemLoadDependencies.IsEmpty())",
                         "this->elemLoadDependencies.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (&this->upwardExposedMarkTempObjectLiveFields);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25c,"(this->upwardExposedMarkTempObjectLiveFields.IsEmpty())",
                         "this->upwardExposedMarkTempObjectLiveFields.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  bVar2 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (((bVar2) && (pOVar4 = IR::Instr::GetDst(instr), pOVar4 != (Opnd *)0x0)) &&
     (bVar2 = IR::Opnd::IsRegOpnd(pOVar4), bVar2)) {
    pRVar5 = IR::Opnd::AsRegOpnd(pOVar4);
    pSStack_30 = pRVar5->m_sym;
    bVar2 = StackSym::IsVar(pSStack_30);
    if (((bVar2) ||
        (pSStack_30 = StackSym::GetVarEquivSym(pSStack_30,(Func *)0x0),
        pSStack_30 != (StackSym *)0x0)) &&
       ((this->upwardExposedMarkTempObjectSymsProperties !=
         (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0 &&
        (bv = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
                        (this->upwardExposedMarkTempObjectSymsProperties,
                         (pSStack_30->super_Sym).m_id),
        bv != (BVSparse<Memory::JitArenaAllocator> *)0x0)))) {
      BVSparse<Memory::JitArenaAllocator>::Minus(&this->upwardExposedMarkTempObjectLiveFields,bv);
      bVar2 = ObjectTemp::IsTempTransfer(instr);
      if (bVar2) {
        pOVar4 = IR::Instr::GetSrc1(instr);
        bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
        if (bVar2) {
          pOVar4 = IR::Instr::GetSrc1(instr);
          pRVar5 = IR::Opnd::AsRegOpnd(pOVar4);
          pSVar6 = Sym::AsStackSym(&pRVar5->m_sym->super_Sym);
          stackSymID = (pSVar6->super_Sym).m_id;
          this_00 = backwardPass->func->m_symTable;
          for (__startIndex = bv->head; __startIndex != (Type_conflict)0x0;
              __startIndex = __startIndex->next) {
            _unit.word._0_4_ = __startIndex->startIndex;
            propertySym = (PropertySym *)(__startIndex->data).word;
            _unit.word._4_4_ =
                 BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propertySym);
            while (_unit.word._4_4_ != 0xffffffff) {
              propertyId = (Type)_unit.word + _unit.word._4_4_;
              BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&propertySym,_unit.word._4_4_)
              ;
              pPVar7 = SymTable::FindPropertySym(this_00,stackSymID,propertyId);
              if (pPVar7 != (PropertySym *)0x0) {
                BVSparse<Memory::JitArenaAllocator>::Set
                          (&this->upwardExposedMarkTempObjectLiveFields,(pPVar7->super_Sym).m_id);
              }
              _unit.word._4_4_ =
                   BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propertySym);
            }
            if (__startIndex == (Type_conflict)0x0) break;
          }
          ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                    FindOrInsert(this->upwardExposedMarkTempObjectSymsProperties,bv,stackSymID);
          if (ppBVar8 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
            return;
          }
          BVSparse<Memory::JitArenaAllocator>::Or(*ppBVar8,bv);
          pJVar9 = TempTrackerBase::GetAllocator(&this->super_TempTrackerBase);
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (pJVar9,bv);
          return;
        }
      }
      pJVar9 = TempTrackerBase::GetAllocator(&this->super_TempTrackerBase);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (pJVar9,bv);
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessInstr(IR::Instr * instr, BackwardPass * backwardPass)
{
#if DBG
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile)
    {
        // If we see BailOnNoProfile, we shouldn't have any successor to have any non temp syms
        Assert(!this->nonTempElemLoad);
        Assert(this->nonTempSyms.IsEmpty());
        Assert(this->tempTransferredSyms.IsEmpty());
        Assert(this->elemLoadDependencies.IsEmpty());
        Assert(this->upwardExposedMarkTempObjectLiveFields.IsEmpty());
    }
#endif

    // We don't get to process all dst in MarkTemp. Do it here for the upwardExposedMarkTempObjectLiveFields
    if (!this->DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        return;
    }

    IR::Opnd * dst = instr->GetDst();
    if (dst == nullptr || !dst->IsRegOpnd())
    {
        return;
    }
    StackSym * dstSym = dst->AsRegOpnd()->m_sym;
    if (!dstSym->IsVar())
    {
        dstSym = dstSym->GetVarEquivSym(nullptr);
        if (dstSym == nullptr)
        {
            return;
        }
    }

    SymID dstSymId = dstSym->m_id;
    if (this->upwardExposedMarkTempObjectSymsProperties)
    {
        // We are assigning to dstSym, it no longer has upward exposed use, get the information and clear it from the hash table
        BVSparse<JitArenaAllocator> * dstBv = this->upwardExposedMarkTempObjectSymsProperties->GetAndClear(dstSymId);
        if (dstBv)
        {
            // Clear the upward exposed live fields of all the property sym id associated to dstSym
            this->upwardExposedMarkTempObjectLiveFields.Minus(dstBv);
            if (ObjectTemp::IsTempTransfer(instr) && instr->GetSrc1()->IsRegOpnd())
            {
                // If it is transfer, copy the dst info to the src
                SymID srcStackSymId = instr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->m_id;

                SymTable * symTable = backwardPass->func->m_symTable;
                FOREACH_BITSET_IN_SPARSEBV(index, dstBv)
                {
                    PropertySym * propertySym = symTable->FindPropertySym(srcStackSymId, index);
                    if (propertySym)
                    {
                        this->upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;

                BVSparse<JitArenaAllocator> ** srcBv = this->upwardExposedMarkTempObjectSymsProperties->FindOrInsert(dstBv, srcStackSymId);
                if (srcBv)
                {
                    (*srcBv)->Or(dstBv);
                    JitAdelete(this->GetAllocator(), dstBv);
                }
            }
            else
            {
                JitAdelete(this->GetAllocator(), dstBv);
            }
        }
    }
}